

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O3

void __thiscall
embree::OBJLoader::OBJLoader
          (OBJLoader *this,FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  _Rb_tree_header *p_Var1;
  pointer *ppCVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  MaterialNode *pMVar6;
  iterator __position;
  pointer pcVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  _Alloc_hider _Var11;
  iterator iVar12;
  iterator iVar13;
  _Alloc_hider _Var14;
  atomic<unsigned_long> *paVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  GroupNode *this_00;
  Node *pNVar19;
  size_t sVar20;
  byte *pbVar21;
  Vec3fa *pVVar22;
  long lVar23;
  Vec3fa *pVVar24;
  iterator iVar25;
  mapped_type *pmVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  size_t sVar28;
  runtime_error *prVar29;
  undefined7 in_register_00000009;
  ulong uVar30;
  Vertex *pVVar31;
  byte bVar32;
  uint uVar33;
  size_t sVar34;
  undefined8 uVar35;
  Vertex *pVVar36;
  ulong uVar37;
  byte *pbVar38;
  ulong uVar39;
  ulong uVar40;
  byte *pbVar41;
  bool bVar42;
  float fVar43;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  string next_line;
  string line;
  ifstream cin;
  byte *local_368;
  OBJLoader *local_360;
  undefined1 local_358 [4];
  undefined4 uStack_354;
  iterator iStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_348;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  Node *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string *local_2e8;
  size_t *local_2e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *local_2d8;
  undefined4 local_2d0;
  int local_2cc;
  string local_2c8;
  undefined8 local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  vector<embree::Crease,_std::allocator<embree::Crease>_> *local_298;
  vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *local_290;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_288;
  vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  *local_280;
  ulong local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  FileName *local_268;
  _Base_ptr local_260;
  string local_258;
  long local_238 [65];
  
  local_2d0 = (undefined4)CONCAT71(in_register_00000009,combineIntoSingleObject);
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (this->group).ptr = this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_268 = &this->path;
  FileName::path(local_268,fileName);
  this->subdivMode = subdivMode;
  local_2e0 = &(this->v).size_active;
  local_290 = (vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)&this->vt;
  local_298 = &this->ec;
  local_280 = &this->curGroup;
  local_288 = &this->curGroupHair;
  local_2e8 = (string *)&this->curMaterialName;
  local_270 = &(this->curMaterialName).field_2;
  (this->v).size_active = 0;
  (this->v).size_alloced = 0;
  (this->v).items = (Vec3fa *)0x0;
  (this->vn).size_active = 0;
  (this->vn).size_alloced = 0;
  (this->vn).items = (Vec3fa *)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curMaterialName)._M_dataplus._M_p = (pointer)local_270;
  (this->curMaterialName)._M_string_length = 0;
  (this->curMaterialName).field_2._M_local_buf[0] = '\0';
  (this->curMaterial).ptr = (MaterialNode *)0x0;
  local_2d8 = &this->material;
  local_260 = &(this->material)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_260;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_260;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar16 = std::__basic_file<char>::is_open();
  if (cVar16 == '\0') {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    _local_358 = (pointer)&aStack_348;
    pcVar7 = (fileName->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_358,pcVar7,pcVar7 + (fileName->filename)._M_string_length);
    std::operator+(&local_308,"cannot open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    std::runtime_error::runtime_error(prVar29,(string *)&local_308);
    __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar19 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_258.field_2._M_allocated_capacity._0_4_ = 0x61666564;
  local_258.field_2._M_allocated_capacity._4_3_ = 0x746c75;
  local_258._M_string_length = 7;
  local_258.field_2._M_local_buf[7] = '\0';
  local_310 = pNVar19;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  SceneGraph::Node::Node(pNVar19,&local_258);
  (pNVar19->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002c6ac0;
  *(undefined4 *)&pNVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&pNVar19[1].fileName._M_string_length = 0;
  *(undefined8 *)((long)&pNVar19[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
  *(undefined4 *)((long)&pNVar19[1].fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&pNVar19[1].fileName.field_2 + 8) = 0;
  pNVar19[1].name._M_dataplus._M_p = (pointer)0x0;
  pNVar19[1].name._M_string_length = 0x3f8000003f800000;
  pNVar19[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&pNVar19[1].name.field_2 + 8) = 0;
  pNVar19[1].indegree = 0;
  pNVar19[1].closed = false;
  pNVar19[1].hasLightOrCamera = false;
  *(undefined2 *)&pNVar19[1].field_0x5a = 0x3f80;
  pNVar19[1].id = 0x3f800000;
  pNVar19[1].geometry = (void *)0x3f8000003f800000;
  memset(pNVar19 + 2,0,0xa8);
  LOCK();
  paVar15 = &(pNVar19->super_RefCount).refCounter;
  (paVar15->super___atomic_base<unsigned_long>)._M_i =
       (paVar15->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)local_2e8,0,(char *)(this->curMaterialName)._M_string_length,0x259e16);
  (*(pNVar19->super_RefCount)._vptr_RefCount[2])(pNVar19);
  pMVar6 = (this->curMaterial).ptr;
  if (pMVar6 != (MaterialNode *)0x0) {
    (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  (this->curMaterial).ptr = (MaterialNode *)pNVar19;
  _local_358 = (pointer)CONCAT44(uStack_354,local_358);
  do {
    iVar17 = std::istream::peek();
    pNVar19 = local_310;
    if (iVar17 == -1) {
      flushTriGroup(this);
      flushHairGroup(this);
      std::ifstream::close();
      (*(pNVar19->super_RefCount)._vptr_RefCount[3])(pNVar19);
      std::ifstream::~ifstream(local_238);
      return;
    }
    local_308._M_string_length = 0;
    local_308.field_2._M_local_buf[0] = '\0';
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    cVar16 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                             (char)(istream *)local_238);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_308,cVar16);
    do {
      if ((local_308._M_string_length == 0) ||
         (local_308._M_dataplus._M_p[local_308._M_string_length - 1] != '\\')) break;
      local_308._M_dataplus._M_p[local_308._M_string_length - 1] = ' ';
      _local_358 = (pointer)&aStack_348;
      iStack_350._M_current._0_4_ = 0;
      iStack_350._M_current._4_4_ = 0;
      aStack_348._M_allocated_capacity = aStack_348._M_allocated_capacity & 0xffffffffffffff00;
      cVar16 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                               (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)local_358,cVar16);
      lVar23 = CONCAT44(iStack_350._M_current._4_4_,(uint)iStack_350._M_current);
      if (lVar23 != 0) {
        std::__cxx11::string::_M_append((char *)&local_308,(ulong)_local_358);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_358 != &aStack_348) {
        operator_delete(_local_358);
      }
    } while (lVar23 != 0);
    _Var14._M_p = local_308._M_dataplus._M_p;
    sVar20 = strspn(local_308._M_dataplus._M_p," \t");
    _Var11._M_p = _local_358;
    if (_Var14._M_p[sVar20] != '\0') {
      pbVar41 = (byte *)(_Var14._M_p + sVar20);
      pbVar38 = pbVar41;
      do {
        pbVar21 = pbVar38;
        pbVar38 = pbVar21 + 1;
      } while (pbVar21[1] != 0);
      for (; (((ulong)*pbVar21 < 0x21 && ((0x100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0)) &&
             (pbVar41 <= pbVar21)); pbVar21 = pbVar21 + -1) {
        *pbVar21 = 0;
      }
      bVar32 = *pbVar41;
      local_368 = pbVar41;
      if (bVar32 != 0) {
        if (bVar32 == 0x66) {
          if ((pbVar41[1] != 0x20) && (pbVar41[1] != 9)) goto LAB_0013e93a;
          pbVar41 = pbVar41 + 1;
          local_368 = pbVar41;
          sVar20 = strspn((char *)pbVar41," \t");
          if (sVar20 == 0) {
            local_360 = this;
            prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar29,"separator expected");
            goto LAB_0013f2f0;
          }
          local_368 = pbVar41 + sVar20;
          local_358 = (undefined1  [4])0x0;
          uStack_354 = 0.0;
          iStack_350._M_current = (Vertex *)0x0;
          aStack_348._M_allocated_capacity = 0;
          bVar32 = pbVar41[sVar20];
          while (bVar32 != 0) {
            local_2c8._0_12_ = getUInt3(this,(char **)&local_368);
            if (iStack_350._M_current == (Vertex *)aStack_348._M_allocated_capacity) {
              std::vector<embree::Vertex,std::allocator<embree::Vertex>>::
              _M_realloc_insert<embree::Vertex_const&>
                        ((vector<embree::Vertex,std::allocator<embree::Vertex>> *)local_358,
                         iStack_350,(Vertex *)&local_2c8);
            }
            else {
              (iStack_350._M_current)->vn = (uint)local_2c8._M_string_length;
              *(pointer *)iStack_350._M_current = local_2c8._M_dataplus._M_p;
              iStack_350._M_current = iStack_350._M_current + 1;
            }
            pbVar41 = local_368;
            sVar20 = strspn((char *)local_368," \t");
            local_368 = pbVar41 + sVar20;
            bVar32 = pbVar41[sVar20];
          }
          std::
          vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
          ::push_back(local_280,(value_type *)local_358);
          _Var11._M_p = _local_358;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_local_358 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_0013edbc;
LAB_0013edb7:
          operator_delete(_local_358);
          _local_358 = _Var11._M_p;
          _Var11._M_p = _local_358;
        }
        else {
          if (bVar32 == 0x76) {
            bVar5 = pbVar41[1];
            if (bVar5 < 0x6e) {
              if ((bVar5 == 9) || (bVar5 == 0x20)) {
                local_368 = pbVar41 + 2;
                getVec3f((embree *)local_358,(char **)&local_368);
                auVar9 = local_328;
                local_328._4_4_ = (uint)iStack_350._M_current;
                local_328._0_4_ = uStack_354;
                sVar34 = (this->v).size_active;
                uVar30 = (this->v).size_alloced;
                uVar37 = sVar34 + 1;
                fVar43 = 0.0;
                uVar45 = (uint)iStack_350._M_current;
                _Var14._M_p = _local_358;
                if (uVar30 < uVar37) {
                  uVar39 = uVar37;
                  uVar40 = uVar30;
                  if (uVar30 != 0) {
                    do {
                      uVar39 = uVar40 * 2 + (ulong)(uVar40 * 2 == 0);
                      uVar40 = uVar39;
                    } while (uVar39 < uVar37);
                  }
                  if (uVar30 != uVar39) {
                    local_328._8_8_ = 0;
                    local_338 = ZEXT416((uint)local_358);
                    pVVar24 = (this->v).items;
                    pVVar22 = (Vec3fa *)alignedMalloc(uVar39 << 4,0x10);
                    (this->v).items = pVVar22;
                    if ((this->v).size_active != 0) {
                      lVar23 = 0;
                      uVar30 = 0;
                      do {
                        puVar4 = (undefined8 *)((long)&pVVar24->field_0 + lVar23);
                        uVar10 = puVar4[1];
                        puVar3 = (undefined8 *)((long)&((this->v).items)->field_0 + lVar23);
                        *puVar3 = *puVar4;
                        puVar3[1] = uVar10;
                        uVar30 = uVar30 + 1;
                        lVar23 = lVar23 + 0x10;
                      } while (uVar30 < (this->v).size_active);
                    }
                    alignedFree(pVVar24);
                    (this->v).size_active = sVar34;
                    (this->v).size_alloced = uVar39;
                    _Var14._M_p = (pointer)CONCAT44(local_328._0_4_,local_338._0_4_);
                    fVar43 = (float)local_338._12_4_;
                    uVar45 = local_328._4_4_;
                    auVar9 = local_328;
                  }
                }
                local_328 = auVar9;
                pVVar24 = (this->v).items;
                (this->v).size_active = uVar37;
                _Var11._M_p = _local_358;
LAB_0013e920:
                pVVar24 = pVVar24 + sVar34;
                *(pointer *)&pVVar24->field_0 = _Var14._M_p;
                *(undefined4 *)((long)&pVVar24->field_0 + 8) = uVar45;
                (pVVar24->field_0).m128[3] = fVar43;
                goto LAB_0013edbc;
              }
            }
            else if (bVar5 == 0x6e) {
              if ((pbVar41[2] == 0x20) || (pbVar41[2] == 9)) {
                local_368 = pbVar41 + 3;
                getVec3f((embree *)local_358,(char **)&local_368);
                auVar9 = local_328;
                local_328._4_4_ = (uint)iStack_350._M_current;
                local_328._0_4_ = uStack_354;
                sVar34 = (this->vn).size_active;
                uVar30 = (this->vn).size_alloced;
                uVar37 = sVar34 + 1;
                fVar43 = 0.0;
                uVar45 = (uint)iStack_350._M_current;
                _Var14._M_p = _local_358;
                if (uVar30 < uVar37) {
                  uVar39 = uVar37;
                  uVar40 = uVar30;
                  if (uVar30 != 0) {
                    do {
                      uVar39 = uVar40 * 2 + (ulong)(uVar40 * 2 == 0);
                      uVar40 = uVar39;
                    } while (uVar39 < uVar37);
                  }
                  if (uVar30 != uVar39) {
                    local_328._8_8_ = 0;
                    local_338 = ZEXT416((uint)local_358);
                    pVVar24 = (this->vn).items;
                    pVVar22 = (Vec3fa *)alignedMalloc(uVar39 << 4,0x10);
                    (this->vn).items = pVVar22;
                    if ((this->vn).size_active != 0) {
                      lVar23 = 0;
                      uVar30 = 0;
                      do {
                        puVar4 = (undefined8 *)((long)&pVVar24->field_0 + lVar23);
                        uVar10 = puVar4[1];
                        puVar3 = (undefined8 *)((long)&((this->vn).items)->field_0 + lVar23);
                        *puVar3 = *puVar4;
                        puVar3[1] = uVar10;
                        uVar30 = uVar30 + 1;
                        lVar23 = lVar23 + 0x10;
                      } while (uVar30 < (this->vn).size_active);
                    }
                    alignedFree(pVVar24);
                    (this->vn).size_active = sVar34;
                    (this->vn).size_alloced = uVar39;
                    _Var14._M_p = (pointer)CONCAT44(local_328._0_4_,local_338._0_4_);
                    fVar43 = (float)local_338._12_4_;
                    uVar45 = local_328._4_4_;
                    auVar9 = local_328;
                  }
                }
                local_328 = auVar9;
                pVVar24 = (this->vn).items;
                (this->vn).size_active = uVar37;
                _Var11._M_p = _local_358;
                goto LAB_0013e920;
              }
            }
            else if ((bVar5 == 0x74) && ((pbVar41[2] == 0x20 || (pbVar41[2] == 9)))) {
              local_368 = pbVar41 + 3;
              sVar20 = strspn((char *)local_368," \t");
              pbVar41 = pbVar41 + sVar20 + 3;
              local_368 = pbVar41;
              dVar8 = atof((char *)pbVar41);
              local_338._8_4_ = extraout_XMM0_Dc;
              local_338._0_8_ = dVar8;
              local_338._12_4_ = extraout_XMM0_Dd;
              sVar20 = strcspn((char *)pbVar41," \t\r");
              pbVar41 = pbVar41 + sVar20;
              local_368 = pbVar41;
              sVar20 = strspn((char *)pbVar41," \t");
              pbVar41 = pbVar41 + sVar20;
              local_368 = pbVar41;
              dVar8 = atof((char *)pbVar41);
              local_328._8_4_ = extraout_XMM0_Dc_00;
              local_328._0_8_ = dVar8;
              local_328._12_4_ = extraout_XMM0_Dd_00;
              sVar20 = strcspn((char *)pbVar41," \t\r");
              local_368 = pbVar41 + sVar20;
              local_358 = (undefined1  [4])(float)(double)local_338._0_8_;
              uStack_354 = (float)(double)local_328._0_8_;
              std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
              emplace_back<embree::Vec2<float>>(local_290,(Vec2<float> *)local_358);
              _Var11._M_p = (pointer)CONCAT44(uStack_354,local_358);
              goto LAB_0013edbc;
            }
          }
LAB_0013e93a:
          iVar17 = strncmp((char *)pbVar41,"hair",4);
          if ((iVar17 == 0) && ((pbVar41[4] == 0x20 || (pbVar41[4] == 9)))) {
            pbVar41 = pbVar41 + 4;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            if (sVar20 == 0) {
              local_360 = this;
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
              goto LAB_0013f2f0;
            }
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            iVar17 = strncmp((char *)pbVar41,"plane",5);
            if ((iVar17 == 0) && ((pbVar41[5] == 0x20 || (pbVar41[5] == 9)))) {
              pbVar41 = pbVar41 + 5;
              local_368 = pbVar41;
              sVar20 = strspn((char *)pbVar41," \t");
              if (sVar20 == 0) {
                local_360 = this;
                prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar29,"separator expected");
LAB_0013f3ee:
                __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
            else {
              iVar17 = strncmp((char *)pbVar41,"cylinder",8);
              _Var11._M_p = _local_358;
              if ((iVar17 != 0) || ((pbVar41[8] != 0x20 && (pbVar41[8] != 9)))) goto LAB_0013edbc;
              pbVar41 = pbVar41 + 8;
              local_368 = pbVar41;
              sVar20 = strspn((char *)pbVar41," \t");
              if (sVar20 == 0) {
                local_360 = this;
                prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar29,"separator expected");
                goto LAB_0013f3ee;
              }
            }
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            uVar33 = atoi((char *)pbVar41);
            sVar20 = strcspn((char *)pbVar41," \t\r");
            pbVar41 = pbVar41 + sVar20;
            iVar12._M_current = (Vertex *)0x0;
            aStack_348._M_allocated_capacity = 0;
            aStack_348._8_8_ = (void *)0x0;
            if (uVar33 == 0x55555555) {
              uVar18 = 0x55555556;
              uVar37 = (ulong)uVar33;
              local_360 = this;
              iVar12._M_current = (Vertex *)0x0;
LAB_0013efca:
              local_328._0_8_ = uVar37 & 0xffffffff;
              local_2a8 = (ulong)uVar18;
              uVar33 = 0;
              uVar37 = 0;
              local_368 = pbVar41;
              iStack_350._M_current = iVar12._M_current;
              do {
                sVar20 = strspn((char *)pbVar41," \t");
                pbVar41 = pbVar41 + sVar20;
                dVar8 = atof((char *)pbVar41);
                local_338._0_4_ = (float)dVar8;
                sVar20 = strcspn((char *)pbVar41," \t\r");
                pbVar41 = pbVar41 + sVar20;
                sVar20 = strspn((char *)pbVar41," \t");
                sVar28 = strcspn((char *)(pbVar41 + sVar20)," \t\r");
                if (uVar37 == 0) {
                  uVar18 = 0;
                }
                else {
                  *(undefined4 *)(aStack_348._8_8_ + 0xc + (ulong)(uVar33 - 1) * 0x10) =
                       local_338._0_4_;
                  uVar18 = uVar33;
                }
                *(undefined4 *)(aStack_348._8_8_ + 0xc + (ulong)uVar18 * 0x10) = local_338._0_4_;
                if (local_328._0_8_ != uVar37) {
                  *(undefined4 *)(aStack_348._8_8_ + 0xc + (ulong)(uVar18 + 1) * 0x10) =
                       local_338._0_4_;
                }
                pbVar41 = pbVar41 + sVar20 + sVar28;
                uVar37 = uVar37 + 1;
                uVar33 = uVar33 + 3;
                iVar12._M_current = iStack_350._M_current;
              } while (local_2a8 != uVar37);
            }
            else {
              local_2cc = uVar33 * 3;
              iVar17 = 0;
              local_368 = pbVar41;
              local_360 = this;
              local_278 = (ulong)uVar33;
              do {
                iStack_350._M_current = iVar12._M_current;
                sVar20 = strspn((char *)pbVar41," \t");
                pbVar41 = pbVar41 + sVar20;
                dVar8 = atof((char *)pbVar41);
                local_338._4_4_ = (int)((ulong)dVar8 >> 0x20);
                local_338._0_4_ = (float)dVar8;
                local_338._8_4_ = extraout_XMM0_Dc_01;
                local_338._12_4_ = extraout_XMM0_Dd_01;
                sVar20 = strcspn((char *)pbVar41," \t\r");
                pbVar38 = pbVar41 + sVar20;
                sVar20 = strspn((char *)pbVar38," \t");
                pbVar41 = pbVar38 + sVar20;
                if (pbVar38[sVar20] == 0) {
                  uVar45 = local_338._0_4_;
                  uVar46 = local_338._4_4_;
                  uVar47 = local_338._8_4_;
                  uVar48 = local_338._12_4_;
                  uVar49 = local_338._0_4_;
                  uVar50 = local_338._4_4_;
                  uVar51 = local_338._8_4_;
                  uVar52 = local_338._12_4_;
                  iVar13._M_current = iStack_350._M_current;
                }
                else {
                  sVar20 = strspn((char *)pbVar41," \t");
                  pbVar41 = pbVar41 + sVar20;
                  dVar8 = atof((char *)pbVar41);
                  local_328._4_4_ = (int)((ulong)dVar8 >> 0x20);
                  local_328._0_4_ = (float)dVar8;
                  local_328._8_4_ = extraout_XMM0_Dc_02;
                  local_328._12_4_ = extraout_XMM0_Dd_02;
                  sVar20 = strcspn((char *)pbVar41," \t\r");
                  sVar28 = strspn((char *)(pbVar41 + sVar20)," \t");
                  pbVar41 = pbVar41 + sVar20 + sVar28;
                  dVar8 = atof((char *)pbVar41);
                  local_2a8 = CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8);
                  uStack_2a0 = extraout_XMM0_Dc_03;
                  uStack_29c = extraout_XMM0_Dd_03;
                  sVar20 = strcspn((char *)pbVar41," \t\r");
                  pbVar41 = pbVar41 + sVar20;
                  uVar45 = local_328._0_4_;
                  uVar46 = local_328._4_4_;
                  uVar47 = local_328._8_4_;
                  uVar48 = local_328._12_4_;
                  uVar49 = (undefined4)local_2a8;
                  uVar50 = local_2a8._4_4_;
                  uVar51 = uStack_2a0;
                  uVar52 = uStack_29c;
                  iVar13._M_current = iStack_350._M_current;
                }
                uVar10 = aStack_348._8_8_;
                iVar12._M_current = (Vertex *)((long)&(iVar13._M_current)->v + 1);
                uVar44 = local_338._0_4_;
                if (aStack_348._M_allocated_capacity < iVar12._M_current) {
                  pVVar36 = iVar12._M_current;
                  uVar35 = aStack_348._M_allocated_capacity;
                  if ((Vertex *)aStack_348._M_allocated_capacity != (Vertex *)0x0) {
                    do {
                      pVVar36 = (Vertex *)(uVar35 * 2 + (ulong)(uVar35 * 2 == 0));
                      uVar35 = pVVar36;
                    } while (pVVar36 < iVar12._M_current);
                  }
                  if ((Vertex *)aStack_348._M_allocated_capacity != pVVar36) {
                    local_2a8 = CONCAT44(uVar50,uVar49);
                    local_328._4_4_ = uVar46;
                    local_328._0_4_ = uVar45;
                    local_328._8_4_ = uVar47;
                    local_328._12_4_ = uVar48;
                    uStack_2a0 = uVar51;
                    uStack_29c = uVar52;
                    iStack_350._M_current = iVar13._M_current;
                    aStack_348._8_8_ = alignedMalloc((long)pVVar36 << 4,0x10);
                    if (iStack_350._M_current != (Vertex *)0x0) {
                      lVar23 = 0;
                      pVVar31 = (Vertex *)0x0;
                      do {
                        puVar4 = (undefined8 *)(uVar10 + lVar23);
                        uVar35 = puVar4[1];
                        *(undefined8 *)(aStack_348._8_8_ + lVar23) = *puVar4;
                        ((undefined8 *)(aStack_348._8_8_ + lVar23))[1] = uVar35;
                        pVVar31 = (Vertex *)((long)&pVVar31->v + 1);
                        lVar23 = lVar23 + 0x10;
                      } while (pVVar31 < iStack_350._M_current);
                    }
                    alignedFree((void *)uVar10);
                    uVar44 = local_338._0_4_;
                    uVar45 = local_328._0_4_;
                    uVar49 = (undefined4)local_2a8;
                    aStack_348._M_allocated_capacity = (size_type)pVVar36;
                  }
                }
                auVar9._4_4_ = uVar45;
                auVar9._0_4_ = uVar44;
                auVar9._8_4_ = uVar49;
                auVar9._12_4_ = 0;
                *(undefined1 (*) [16])(aStack_348._8_8_ + (long)iVar13._M_current * 0x10) = auVar9;
                bVar42 = iVar17 != local_2cc;
                iVar17 = iVar17 + 1;
              } while (bVar42);
              uVar18 = (int)local_278 + 1;
              uVar37 = local_278;
              if (uVar18 != 0) goto LAB_0013efca;
            }
            local_368 = pbVar41;
            iStack_350._M_current = iVar12._M_current;
            std::
            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ::push_back(local_288,(value_type *)local_358);
            alignedFree((void *)aStack_348._8_8_);
            bVar32 = *pbVar41;
            this = local_360;
          }
          if (((bVar32 == 0x65) && (pbVar41[1] == 99)) &&
             ((pbVar41[2] == 0x20 || (pbVar41[2] == 9)))) {
            pbVar41 = pbVar41 + 2;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            if (sVar20 == 0) {
              local_360 = this;
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
LAB_0013f2f0:
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            dVar8 = atof((char *)pbVar41);
            local_338._0_8_ = dVar8;
            sVar20 = strcspn((char *)pbVar41," \t\r");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            iVar17 = atoi((char *)pbVar41);
            sVar20 = strcspn((char *)pbVar41," \t\r");
            pbVar41 = pbVar41 + sVar20;
            if (iVar17 < 1) {
              if (iVar17 == 0) {
                local_328._0_4_ = 0;
              }
              else {
                local_328._0_4_ = iVar17 + (int)*local_2e0;
              }
            }
            else {
              local_328._0_4_ = iVar17 + -1;
            }
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            pbVar41 = pbVar41 + sVar20;
            local_368 = pbVar41;
            iVar17 = atoi((char *)pbVar41);
            sVar20 = strcspn((char *)pbVar41," \t\r");
            pbVar41 = pbVar41 + sVar20;
            if (iVar17 < 1) {
              if (iVar17 == 0) {
                uVar33 = 0;
              }
              else {
                uVar33 = iVar17 + (int)*local_2e0;
              }
            }
            else {
              uVar33 = iVar17 - 1;
            }
            fVar43 = (float)(double)local_338._0_8_;
            local_338._0_4_ = fVar43;
            local_368 = pbVar41;
            sVar20 = strspn((char *)pbVar41," \t");
            iStack_350._M_current = (Vertex *)CONCAT44(iStack_350._M_current._4_4_,uVar33);
            local_368 = pbVar41 + sVar20;
            local_358 = (undefined1  [4])local_338._0_4_;
            uStack_354 = (float)local_328._0_4_;
            __position._M_current =
                 (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              iStack_350._M_current._0_4_ = uVar33;
              std::vector<embree::Crease,_std::allocator<embree::Crease>_>::
              _M_realloc_insert<embree::Crease>(local_298,__position,(Crease *)local_358);
              _Var11._M_p = (pointer)CONCAT44(uStack_354,local_358);
            }
            else {
              (__position._M_current)->b = uVar33;
              (__position._M_current)->w = (float)local_338._0_4_;
              (__position._M_current)->a = local_328._0_4_;
              ppCVar2 = &(this->ec).
                         super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl
                         .super__Vector_impl_data._M_finish;
              *ppCVar2 = *ppCVar2 + 1;
              _Var11._M_p = (pointer)CONCAT44(local_328._0_4_,local_338._0_4_);
            }
          }
          else {
            iVar17 = strncmp((char *)pbVar41,"usemtl",6);
            if ((iVar17 == 0) && ((pbVar41[6] == 0x20 || (pbVar41[6] == 9)))) {
              if ((char)local_2d0 == '\0') {
                flushTriGroup(this);
                flushHairGroup(this);
              }
              pbVar41 = pbVar41 + 6;
              local_368 = pbVar41;
              sVar20 = strspn((char *)pbVar41," \t");
              if (sVar20 == 0) {
                local_360 = this;
                prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar29,"separator expected");
                __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pbVar41 = pbVar41 + sVar20;
              _local_358 = (pointer)&aStack_348;
              local_368 = pbVar41;
              sVar20 = strlen((char *)pbVar41);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_358,pbVar41,pbVar41 + sVar20);
              iVar25 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                       ::find(&local_2d8->_M_t,(key_type *)local_358);
              if (iVar25._M_node == local_260) {
                (*(local_310->super_RefCount)._vptr_RefCount[2])();
                pMVar6 = (this->curMaterial).ptr;
                if (pMVar6 != (MaterialNode *)0x0) {
                  (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
                }
                (this->curMaterial).ptr = (MaterialNode *)local_310;
                std::__cxx11::string::_M_replace
                          ((ulong)local_2e8,0,(char *)(this->curMaterialName)._M_string_length,
                           0x259e16);
              }
              else {
                pmVar26 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                          ::operator[](local_2d8,(key_type *)local_358);
                if (pmVar26->ptr != (MaterialNode *)0x0) {
                  (*(pmVar26->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
                }
                pMVar6 = (this->curMaterial).ptr;
                if (pMVar6 != (MaterialNode *)0x0) {
                  (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
                }
                (this->curMaterial).ptr = pmVar26->ptr;
                std::__cxx11::string::_M_assign(local_2e8);
              }
              paVar27 = &aStack_348;
              _Var11._M_p = _local_358;
            }
            else {
              iVar17 = strncmp((char *)pbVar41,"mtllib",6);
              _Var11._M_p = _local_358;
              if ((iVar17 != 0) || ((pbVar41[6] != 0x20 && (pbVar41[6] != 9)))) goto LAB_0013edbc;
              pbVar41 = pbVar41 + 6;
              local_368 = pbVar41;
              sVar20 = strspn((char *)pbVar41," \t");
              if (sVar20 == 0) {
                local_360 = this;
                prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar29,"separator expected");
                __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pbVar41 = pbVar41 + sVar20;
              local_2c8._M_dataplus._M_p = (pointer)((long)&local_2c8 + 0x10);
              local_368 = pbVar41;
              sVar20 = strlen((char *)pbVar41);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2c8,pbVar41,pbVar41 + sVar20);
              FileName::operator+((FileName *)local_358,local_268,&local_2c8);
              loadMTL(this,(FileName *)local_358);
              _Var11._M_p = _local_358;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_local_358 != &aStack_348) {
                operator_delete(_local_358);
                _Var11._M_p = _local_358;
              }
              paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&local_2c8 + 0x10);
              _local_358 = local_2c8._M_dataplus._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_358 != paVar27) goto LAB_0013edb7;
          }
        }
      }
    }
LAB_0013edbc:
    _local_358 = _Var11._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

OBJLoader::OBJLoader(const FileName &fileName, const bool subdivMode, const bool combineIntoSingleObject) 
    : group(new SceneGraph::GroupNode), path(fileName.path()), subdivMode(subdivMode)
  {
    /* open file */
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      THROW_RUNTIME_ERROR("cannot open " + fileName.str());
      return;
    }

    /* generate default material */
    Ref<SceneGraph::MaterialNode> defaultMaterial = new OBJMaterial("default");
    curMaterialName = "default";
    curMaterial = defaultMaterial;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));
      if (token[0] == 0) continue;

      /*! parse position */
      if (token[0] == 'v' && isSep(token[1])) { 
        v.push_back(getVec3f(token += 2)); continue;
      }

      /* parse normal */
      if (token[0] == 'v' && token[1] == 'n' && isSep(token[2])) { 
        vn.push_back(getVec3f(token += 3)); 
        continue; 
      }

      /* parse texcoord */
      if (token[0] == 'v' && token[1] == 't' && isSep(token[2])) { vt.push_back(getVec2f(token += 3)); continue; }

      /*! parse face */
      if (token[0] == 'f' && isSep(token[1]))
      {
        parseSep(token += 1);

        std::vector<Vertex> face;
        while (token[0]) {
	  Vertex vtx = getUInt3(token);
          face.push_back(vtx);
          parseSepOpt(token);
        }
        curGroup.push_back(face);
        continue;
      }

      /*! parse corona hair */
      if (!strncmp(token,"hair",4) && isSep(token[4]))
      {
        parseSep(token += 4);
        bool plane = !strncmp(token,"plane",5) && isSep(token[5]);
        if (plane) {
          parseSep(token += 5);
        }
        else if (!strncmp(token,"cylinder",8) && isSep(token[8])) {
          parseSep(token += 8);
        }
        else continue;

        unsigned int N = getInt(token);
        avector<Vec3ff> hair;
        for (unsigned int i=0; i<3*N+1; i++) {
          hair.push_back((Vec3ff)getVec3fa(token));
        }
        
        for (unsigned int i=0; i<N+1; i++)
        {
          float r = getFloat(token);
          MAYBE_UNUSED float t = (float)getInt(token);
          if (i != 0) hair[3*i-1].w = r;
          hair[3*i+0].w = r;
          if (i != N) hair[3*i+1].w = r;
        }
        curGroupHair.push_back(hair);
      }
      
      /*! parse edge crease */
      if (token[0] == 'e' && token[1] == 'c' && isSep(token[2]))
      {
	parseSep(token += 2);
	float w = getFloat(token);
	parseSepOpt(token);
	unsigned int a = fix_v(getInt(token));
	parseSepOpt(token);
	unsigned int b = fix_v(getInt(token));
	parseSepOpt(token);
	ec.push_back(Crease(w, a, b));
	continue;
      }

      /*! use material */
      if (!strncmp(token, "usemtl", 6) && isSep(token[6]))
      {
        if (!combineIntoSingleObject) flushFaceGroup();
        std::string name(parseSep(token += 6));
        if (material.find(name) == material.end()) {
          curMaterial = defaultMaterial;
          curMaterialName = "default";
        }
        else {
          curMaterial = material[name];
          curMaterialName = name;
        }
        continue;
      }

      /* load material library */
      if (!strncmp(token, "mtllib", 6) && isSep(token[6])) {
        loadMTL(path + std::string(parseSep(token += 6)));
        continue;
      }

      // ignore unknown stuff
    }
    flushFaceGroup();

    cin.close();
  }